

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

LiteralExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::LiteralExpressionSyntax,slang::syntax::SyntaxKind&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxKind *args,Token *args_1)

{
  Info *pIVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  LiteralExpressionSyntax *pLVar6;
  
  pLVar6 = (LiteralExpressionSyntax *)allocate(this,0x28,8);
  TVar2 = args_1->kind;
  uVar3 = args_1->field_0x2;
  NVar4.raw = (args_1->numFlags).raw;
  uVar5 = args_1->rawLen;
  pIVar1 = args_1->info;
  (pLVar6->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.kind = *args;
  (pLVar6->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.parent =
       (SyntaxNode *)0x0;
  (pLVar6->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode =
       (SyntaxNode *)0x0;
  (pLVar6->literal).kind = TVar2;
  (pLVar6->literal).field_0x2 = uVar3;
  (pLVar6->literal).numFlags = (NumericTokenFlags)NVar4.raw;
  (pLVar6->literal).rawLen = uVar5;
  (pLVar6->literal).info = pIVar1;
  return pLVar6;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }